

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTable::focusChild(QAccessibleTable *this)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QListView *this_01;
  QHeaderView *pQVar5;
  QHeaderView *pQVar6;
  QAccessibleInterface *pQVar7;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.r = -0x55555556;
  local_48.c = -0x55555556;
  local_48.i._0_4_ = 0xaaaaaaaa;
  local_48.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  QAbstractItemView::currentIndex(&local_48,this_00);
  iVar2 = local_48.c;
  pQVar7 = (QAccessibleInterface *)0x0;
  if (((-1 < local_48.r) && (-1 < local_48.c)) && (local_48.m.ptr != (QAbstractItemModel *)0x0)) {
    if (this->m_role == List) {
      (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
      QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
      iVar3 = QListView::modelColumn(this_01);
      iVar4 = -1;
      if (iVar2 == iVar3) {
        iVar4 = local_48.r;
      }
    }
    else {
      pQVar5 = verticalHeader(this);
      pQVar6 = horizontalHeader(this);
      iVar2 = local_48.r + 1;
      iVar4 = (**(code **)(*(long *)this + 0x58))(this);
      iVar4 = (uint)(pQVar5 != (QHeaderView *)0x0) + local_48.c +
              (iVar4 + (uint)(pQVar5 != (QHeaderView *)0x0)) *
              (iVar2 - (uint)(pQVar6 == (QHeaderView *)0x0));
    }
    pQVar7 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar7;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::focusChild() const
{
    QModelIndex index = view()->currentIndex();
    if (!index.isValid())
        return nullptr;

    return child(logicalIndex(index));
}